

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.h
# Opt level: O0

void __thiscall wirehair::PCGRandom::Seed(PCGRandom *this,uint64_t y,uint64_t x)

{
  uint64_t x_local;
  uint64_t y_local;
  PCGRandom *this_local;
  uint32_t rot_1;
  uint32_t xorshifted_1;
  uint64_t oldstate_1;
  uint32_t rot;
  uint32_t xorshifted;
  uint64_t oldstate;
  
  this->State = 0;
  this->Inc = y << 1 | 1;
  this->State = this->State * 0x5851f42d4c957f2d + this->Inc;
  this->State = x + this->State;
  this->State = this->State * 0x5851f42d4c957f2d + this->Inc;
  return;
}

Assistant:

void Seed(uint64_t y, uint64_t x = 0)
    {
        State = 0;
        Inc = (y << 1u) | 1u;
        Next();
        State += x;
        Next();
    }